

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall
slang::parsing::Parser::scanQualifiedName(Parser *this,uint32_t *index,bool allowNew)

{
  uint32_t uVar1;
  bool bVar2;
  Token TVar3;
  TokenKind local_68;
  TokenKind local_58;
  TokenKind local_48;
  TokenKind local_38;
  Token next;
  bool allowNew_local;
  uint32_t *index_local;
  Parser *this_local;
  
  TVar3 = ParserBase::peek(&this->super_ParserBase,*index);
  local_38 = TVar3.kind;
  if (local_38 == Identifier) goto LAB_00558b2d;
  if (local_38 == UnitSystemName) goto LAB_00558b2d;
  do {
    if ((!allowNew) || (local_38 != NewKeyword)) {
      return false;
    }
LAB_00558b2d:
    do {
      uVar1 = *index;
      *index = uVar1 + 1;
      TVar3 = ParserBase::peek(&this->super_ParserBase,uVar1 + 1);
      local_48 = TVar3.kind;
      if (local_48 == Hash) {
        uVar1 = *index;
        *index = uVar1 + 1;
        TVar3 = ParserBase::peek(&this->super_ParserBase,uVar1 + 1);
        local_58 = TVar3.kind;
        if (local_58 != OpenParenthesis) {
          return false;
        }
        *index = *index + 1;
        bVar2 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                          (this,index,OpenParenthesis,CloseParenthesis);
        if (!bVar2) {
          return false;
        }
      }
      TVar3 = ParserBase::peek(&this->super_ParserBase,*index);
      local_68 = TVar3.kind;
      if (local_68 != DoubleColon) {
        return true;
      }
      uVar1 = *index;
      *index = uVar1 + 1;
      TVar3 = ParserBase::peek(&this->super_ParserBase,uVar1 + 1);
      local_38 = TVar3.kind;
    } while (local_38 == Identifier);
  } while( true );
}

Assistant:

bool Parser::scanQualifiedName(uint32_t& index, bool allowNew) {
    auto next = peek(index);
    if (next.kind != TokenKind::Identifier && next.kind != TokenKind::UnitSystemName &&
        (!allowNew || next.kind != TokenKind::NewKeyword)) {
        return false;
    }

    while (true) {
        if (peek(++index).kind == TokenKind::Hash) {
            // scan parameter value assignment
            if (peek(++index).kind != TokenKind::OpenParenthesis)
                return false;

            index++;
            if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                           TokenKind::CloseParenthesis)) {
                return false;
            }
        }

        if (peek(index).kind != TokenKind::DoubleColon)
            break;

        next = peek(++index);
        if (next.kind != TokenKind::Identifier && (!allowNew || next.kind != TokenKind::NewKeyword))
            return false;
    }
    return true;
}